

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IndexBeginWrite(Fts5Index *p,int bDelete,i64 iRowid)

{
  int iVar1;
  i64 iRowid_local;
  int bDelete_local;
  Fts5Index *p_local;
  
  if (p->pHash == (Fts5Hash *)0x0) {
    iVar1 = sqlite3Fts5HashNew(p->pConfig,&p->pHash,&p->nPendingData);
    p->rc = iVar1;
  }
  if ((iRowid < p->iWriteRowid) ||
     (((iRowid == p->iWriteRowid && (p->bDelete == 0)) || (p->pConfig->nHashSize < p->nPendingData))
     )) {
    fts5IndexFlush(p);
  }
  p->iWriteRowid = iRowid;
  p->bDelete = bDelete;
  iVar1 = fts5IndexReturn(p);
  return iVar1;
}

Assistant:

static int sqlite3Fts5IndexBeginWrite(Fts5Index *p, int bDelete, i64 iRowid){
  assert( p->rc==SQLITE_OK );

  /* Allocate the hash table if it has not already been allocated */
  if( p->pHash==0 ){
    p->rc = sqlite3Fts5HashNew(p->pConfig, &p->pHash, &p->nPendingData);
  }

  /* Flush the hash table to disk if required */
  if( iRowid<p->iWriteRowid 
   || (iRowid==p->iWriteRowid && p->bDelete==0)
   || (p->nPendingData > p->pConfig->nHashSize) 
  ){
    fts5IndexFlush(p);
  }

  p->iWriteRowid = iRowid;
  p->bDelete = bDelete;
  return fts5IndexReturn(p);
}